

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

int ggwave_ndecode(ggwave_Instance id,void *waveformBuffer,int waveformSize,void *payloadBuffer,
                  int payloadSize)

{
  GGWave *this;
  bool bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  this = (GGWave *)(&(anonymous_namespace)::g_instances)[id];
  bVar1 = GGWave::decode(this,waveformBuffer,waveformSize);
  if (bVar1) {
    lVar2 = __tls_get_addr(&PTR_0010ffb8);
    if (*(char *)(lVar2 + 0x28) == '\0') {
      ggwave_ndecode_cold_1();
    }
    uVar4 = (this->m_rx).dataLength;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      (this->m_rx).dataLength = 0;
      if (uVar4 != 0xffffffff) {
        *(undefined8 *)(lVar2 + 0x18) = (this->m_rx).data.m_data;
        *(uint *)(lVar2 + 0x20) = uVar4;
      }
    }
    if (uVar4 == 0xffffffff) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = 0xfffffffe;
      if (((int)uVar4 <= payloadSize) && (uVar3 = uVar4, 0 < (int)uVar4)) {
        memcpy(payloadBuffer,*(void **)(lVar2 + 0x18),(ulong)uVar4);
      }
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Failed to decode data - GGWave instance %d\n",
              (ulong)(uint)id);
    }
  }
  return uVar3;
}

Assistant:

int ggwave_ndecode(
        ggwave_Instance id,
        const void * waveformBuffer,
        int waveformSize,
        void * payloadBuffer,
        int payloadSize) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave->decode(waveformBuffer, waveformSize) == false) {
        ggprintf("Failed to decode data - GGWave instance %d\n", id);
        return -1;
    }

    static thread_local GGWave::TxRxData data;

    const auto dataLength = ggWave->rxTakeData(data);
    if (dataLength == -1) {
        // failed to decode message
        return -1;
    } else if (dataLength > payloadSize) {
        // the payloadBuffer is not big enough to store the data
        return -2;
    } else if (dataLength > 0) {
        memcpy(payloadBuffer, data.data(), dataLength);
    }

    return dataLength;
}